

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 __thiscall DROPlayer::UnloadFile(DROPlayer *this)

{
  DROPlayer *this_local;
  
  if ((this->_playState & 1) == 0) {
    this->_playState = '\0';
    this->_dLoad = (DATA_LOADER *)0x0;
    this->_fileData = (UINT8 *)0x0;
    (this->_fileHdr).verMajor = 0xff;
    this->_dataOfs = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_devTypes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_devPanning);
    std::vector<_dro_chip_device,_std::allocator<_dro_chip_device>_>::clear(&this->_devices);
    this_local._7_1_ = '\0';
  }
  else {
    this_local._7_1_ = 0xff;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 DROPlayer::UnloadFile(void)
{
	if (_playState & PLAYSTATE_PLAY)
		return 0xFF;
	
	_playState = 0x00;
	_dLoad = NULL;
	_fileData = NULL;
	_fileHdr.verMajor = 0xFF;
	_dataOfs = 0x00;
	_devTypes.clear();
	_devPanning.clear();
	_devices.clear();
	
	return 0x00;
}